

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  BasicResult<void> *this_local;
  
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type == LogicError) {
    __assert_fail("m_type != ResultBase::LogicError",
                  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/build_O0/test/catch.hpp"
                  ,0x233d,
                  "virtual void Catch::clara::detail::BasicResult<>::enforceOk() const [T = void]");
  }
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != RuntimeError) {
    if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
      abort();
    }
    return;
  }
  __assert_fail("m_type != ResultBase::RuntimeError",
                "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/build_O0/test/catch.hpp"
                ,0x233e,
                "virtual void Catch::clara::detail::BasicResult<>::enforceOk() const [T = void]");
}

Assistant:

void enforceOk() const override {

            // Errors shouldn't reach this point, but if they do
            // the actual error message will be in m_errorMessage
            assert( m_type != ResultBase::LogicError );
            assert( m_type != ResultBase::RuntimeError );
            if( m_type != ResultBase::Ok )
                std::abort();
        }